

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O0

void __thiscall Liby::TimerQueue::start(TimerQueue *this)

{
  pointer pCVar1;
  anon_class_8_1_8991fb9c local_70;
  BasicHandler local_68;
  anon_class_8_1_8991fb9c local_38;
  BasicHandler local_30;
  TimerQueue *local_10;
  TimerQueue *this_local;
  
  local_10 = this;
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->timerChan_);
  Channel::enableRead(pCVar1,true);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->timerChan_);
  local_38.this = this;
  std::function<void()>::function<Liby::TimerQueue::start()::__0,void>
            ((function<void()> *)&local_30,&local_38);
  Channel::onErro(pCVar1,&local_30);
  std::function<void_()>::~function(&local_30);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->timerChan_);
  local_70.this = this;
  std::function<void()>::function<Liby::TimerQueue::start()::__1,void>
            ((function<void()> *)&local_68,&local_70);
  Channel::onRead(pCVar1,&local_68);
  std::function<void_()>::~function(&local_68);
  pCVar1 = std::unique_ptr<Liby::Channel,_std::default_delete<Liby::Channel>_>::operator->
                     (&this->timerChan_);
  Channel::addChannel(pCVar1);
  return;
}

Assistant:

void TimerQueue::start() {
#ifdef __linux__
    timerChan_->enableRead();
    timerChan_->onErro([this] { destroy(); });
    timerChan_->onRead([this] {
        if (timerfd_ < 0) {
            error("timerfd < 0");
        }

        uint64_t n;
        while (1) {
            int ret = ::read(timerfd_, &n, sizeof(n));
            if (ret <= 0)
                break;
        }

        handleTimeoutEvents();
    });
    timerChan_->addChannel();
#endif
}